

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O0

void heapsortx(void *base,size_t nmemb,size_t size,cmp_f cmp,void *opaque)

{
  int iVar1;
  exchange_f p_Var2;
  ulong uVar3;
  code *in_RCX;
  size_t in_RDX;
  ulong in_RSI;
  void *in_RDI;
  undefined8 in_R8;
  exchange_f swap;
  size_t r;
  size_t c;
  size_t n;
  size_t i;
  uint8_t *basep;
  ulong local_50;
  ulong local_48;
  ulong local_38;
  
  p_Var2 = exchange_func(in_RDI,in_RDX);
  if (1 < in_RSI) {
    local_38 = (in_RSI >> 1) * in_RDX;
    uVar3 = in_RSI * in_RDX;
LAB_0011b4b9:
    if (local_38 != 0) {
      local_38 = local_38 - in_RDX;
      local_50 = local_38;
      while (local_48 = local_50 * 2 + in_RDX, local_48 < uVar3) {
        if ((local_48 < uVar3 - in_RDX) &&
           (iVar1 = (*in_RCX)((long)in_RDI + local_48,(long)in_RDI + in_RDX + local_48,in_R8),
           iVar1 < 1)) {
          local_48 = in_RDX + local_48;
        }
        iVar1 = (*in_RCX)((long)in_RDI + local_50,(long)in_RDI + local_48,in_R8);
        if (0 < iVar1) break;
        (*p_Var2)((void *)((long)in_RDI + local_50),(void *)((long)in_RDI + local_48),in_RDX);
        local_50 = local_48;
      }
      goto LAB_0011b4b9;
    }
    for (local_38 = uVar3 - in_RDX; local_38 != 0; local_38 = local_38 - in_RDX) {
      (*p_Var2)(in_RDI,(void *)((long)in_RDI + local_38),in_RDX);
      local_50 = 0;
      while (local_48 = local_50 * 2 + in_RDX, local_48 < local_38) {
        if ((local_48 < local_38 - in_RDX) &&
           (iVar1 = (*in_RCX)((long)in_RDI + local_48,(long)in_RDI + in_RDX + local_48,in_R8),
           iVar1 < 1)) {
          local_48 = in_RDX + local_48;
        }
        iVar1 = (*in_RCX)((long)in_RDI + local_50,(long)in_RDI + local_48,in_R8);
        if (0 < iVar1) break;
        (*p_Var2)((void *)((long)in_RDI + local_50),(void *)((long)in_RDI + local_48),in_RDX);
        local_50 = local_48;
      }
    }
  }
  return;
}

Assistant:

static void heapsortx(void *base, size_t nmemb, size_t size, cmp_f cmp, void *opaque)
{
    uint8_t *basep = (uint8_t *)base;
    size_t i, n, c, r;
    exchange_f swap = exchange_func(base, size);

    if (nmemb > 1) {
        i = (nmemb / 2) * size;
        n = nmemb * size;

        while (i > 0) {
            i -= size;
            for (r = i; (c = r * 2 + size) < n; r = c) {
                if (c < n - size && cmp(basep + c, basep + c + size, opaque) <= 0)
                    c += size;
                if (cmp(basep + r, basep + c, opaque) > 0)
                    break;
                swap(basep + r, basep + c, size);
            }
        }
        for (i = n - size; i > 0; i -= size) {
            swap(basep, basep + i, size);

            for (r = 0; (c = r * 2 + size) < i; r = c) {
                if (c < i - size && cmp(basep + c, basep + c + size, opaque) <= 0)
                    c += size;
                if (cmp(basep + r, basep + c, opaque) > 0)
                    break;
                swap(basep + r, basep + c, size);
            }
        }
    }
}